

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  pointer ppVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  _Base_ptr p_Var8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last_00;
  char cVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  String *local_130;
  pointer local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  String s;
  String d;
  OptionHelp format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
          ::find(&(this->m_help)._M_t,g);
  local_130 = __return_storage_ptr__;
  if ((_Rb_tree_header *)cVar4._M_node == &(this->m_help)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&arg);
  }
  else {
    format.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    format.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    format.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (g->_M_string_length != 0) {
      std::operator+(&local_120," ",g);
      std::operator+(&local_150,&local_120," options:\n\n");
      arg._M_dataplus._M_p = (pointer)&arg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p == &local_150.field_2) {
        arg.field_2._8_8_ = local_150.field_2._8_8_;
      }
      else {
        arg._M_dataplus._M_p = local_150._M_dataplus._M_p;
      }
      arg.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
      arg._M_string_length = local_150._M_string_length;
      local_150._M_string_length = 0;
      local_150.field_2._M_allocated_capacity =
           local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::append((string *)local_130);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_120);
    }
    local_128 = (pointer)cVar4._M_node[4]._M_parent;
    p_Var8 = (_Base_ptr)0x0;
    for (__rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(cVar4._M_node + 4) + 0x90); (pointer)&__rhs[-5].field_2 != local_128;
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &__rhs[6].field_2) {
      std::__cxx11::string::string((string *)&s,"  ",(allocator *)&arg);
      if (*(long *)((long)&__rhs[-5].field_2 + 8) == 0) {
        std::__cxx11::string::append((char *)&s);
      }
      else {
        std::operator+(&local_150,"-",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__rhs[-5].field_2);
        std::operator+(&arg,&local_150,",");
        std::__cxx11::string::append((string *)&s);
        std::__cxx11::string::~string((string *)&arg);
        std::__cxx11::string::~string((string *)&local_150);
      }
      if (*(long *)((long)&__rhs[-4].field_2 + 8) != 0) {
        std::operator+(&arg," --",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__rhs[-4].field_2);
        std::__cxx11::string::append((string *)&s);
        std::__cxx11::string::~string((string *)&arg);
      }
      if (__rhs[-2].field_2._M_local_buf[0] == '\x01') {
        if (__rhs[1]._M_string_length == 0) {
          std::__cxx11::string::string((string *)&arg,"arg",(allocator *)&local_150);
        }
        else {
          std::__cxx11::string::string((string *)&arg,(string *)(__rhs + 1));
        }
        if (__rhs[-1].field_2._M_local_buf[8] == '\x01') {
          std::operator+(&d," [=",&arg);
          std::operator+(&local_50,&d,"(=");
          std::operator+(&local_120,&local_50,__rhs);
          std::operator+(&local_150,&local_120,")]");
          std::__cxx11::string::append((string *)&s);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_50);
          this_00 = &d;
        }
        else {
          std::operator+(&local_150," ",&arg);
          std::__cxx11::string::append((string *)&s);
          this_00 = &local_150;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::~string((string *)&arg);
      }
      if (p_Var8 <= s._M_string_length) {
        p_Var8 = (_Base_ptr)s._M_string_length;
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      local_150._M_string_length = 0;
      local_150.field_2._M_allocated_capacity =
           local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&arg,&s,&local_150);
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&format,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&arg);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&arg);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&s);
    }
    p_Var5 = (_Base_ptr)0x1e;
    if (p_Var8 < (_Base_ptr)0x1e) {
      p_Var5 = p_Var8;
    }
    p_Var2 = cVar4._M_node[4]._M_parent;
    cVar9 = (char)p_Var5 + '\x02';
    ppVar7 = format.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (p_Var8 = *(_Base_ptr *)(cVar4._M_node + 4); p_Var8 != p_Var2;
        p_Var8 = (_Base_ptr)&p_Var8[6]._M_left) {
      std::__cxx11::string::string((string *)&arg,(string *)(p_Var8 + 2));
      if (*(byte *)((long)&p_Var8[3]._M_color + 1) == 1) {
        std::operator+(&local_50," (default:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var8[3]._M_parent);
        std::operator+(&local_120,&local_50,")");
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p == &local_120.field_2) {
          local_150.field_2._8_8_ = local_120.field_2._8_8_;
        }
        else {
          local_150._M_dataplus._M_p = local_120._M_dataplus._M_p;
        }
        local_150.field_2._M_allocated_capacity._1_7_ =
             local_120.field_2._M_allocated_capacity._1_7_;
        local_150.field_2._M_local_buf[0] = local_120.field_2._M_local_buf[0];
        local_150._M_string_length = local_120._M_string_length;
        local_120._M_string_length = 0;
        local_120.field_2._M_local_buf[0] = '\0';
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::append((string *)&arg);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_50);
      }
      d._M_dataplus._M_p = (pointer)&d.field_2;
      d._M_string_length = 0;
      d.field_2._M_local_buf[0] = '\0';
      uVar6 = 0;
      __last._M_current = arg._M_dataplus._M_p;
      __first._M_current = arg._M_dataplus._M_p;
      local_128 = ppVar7;
      for (__last_00._M_current = arg._M_dataplus._M_p;
          __last_00._M_current != arg._M_dataplus._M_p + arg._M_string_length;
          __last_00._M_current = __last_00._M_current + 1) {
        if (*__last_00._M_current == ' ') {
          __last._M_current = __last_00._M_current;
        }
        if (0x4aU - (long)p_Var5 < uVar6) {
          if (__last._M_current == __first._M_current) {
            __last._M_current = __last_00._M_current + 1;
            std::__cxx11::string::
            append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                      ((string *)&d,__first,__last);
            std::__cxx11::string::string((string *)&local_150,"\n",(allocator *)&local_50);
            std::__cxx11::string::append((string *)&d);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::append((ulong)&d,cVar9);
            __first._M_current = __last._M_current;
          }
          else {
            std::__cxx11::string::
            append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                      ((string *)&d,__first,__last);
            std::__cxx11::string::string((string *)&local_120,"\n",(allocator *)&local_50);
            std::__cxx11::string::append((string *)&d);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::append((ulong)&d,cVar9);
            __first._M_current = __last._M_current + 1;
          }
          uVar6 = 0;
        }
        else {
          uVar6 = uVar6 + 1;
        }
      }
      std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((string *)&d,__first,__last_00);
      std::__cxx11::string::~string((string *)&arg);
      ppVar7 = local_128;
      std::__cxx11::string::append((string *)local_130);
      p_Var3 = (_Base_ptr)(ppVar7->first)._M_string_length;
      if (p_Var5 < p_Var3) {
        std::__cxx11::string::append((char *)local_130);
        paVar1 = &local_150.field_2;
        local_150._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_150,cVar9);
        arg._M_dataplus._M_p = (pointer)&arg.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p == paVar1) {
          arg.field_2._8_8_ = local_150.field_2._8_8_;
        }
        else {
          arg._M_dataplus._M_p = local_150._M_dataplus._M_p;
        }
        arg.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
        arg._M_string_length = local_150._M_string_length;
        local_150._M_string_length = 0;
        local_150.field_2._M_allocated_capacity =
             local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_150._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::append((string *)local_130);
      }
      else {
        paVar1 = &local_150.field_2;
        local_150._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_150,cVar9 - (char)p_Var3);
        arg._M_dataplus._M_p = (pointer)&arg.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p == paVar1) {
          arg.field_2._8_8_ = local_150.field_2._8_8_;
        }
        else {
          arg._M_dataplus._M_p = local_150._M_dataplus._M_p;
        }
        arg.field_2._M_allocated_capacity = local_150.field_2._M_allocated_capacity;
        arg._M_string_length = local_150._M_string_length;
        local_150._M_string_length = 0;
        local_150.field_2._M_allocated_capacity =
             local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_150._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::append((string *)local_130);
      }
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)&local_150);
      ppVar7 = local_128;
      std::__cxx11::string::append((string *)local_130);
      std::__cxx11::string::append((char *)local_130);
      ppVar7 = ppVar7 + 1;
      std::__cxx11::string::~string((string *)&d);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&format);
  }
  return local_130;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n\n");
  }

  for (const auto& o : group->second.options)
  {
    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += "\n";
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += "\n";

    ++fiter;
  }

  return result;
}